

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void printSymName(char *name)

{
  bool bVar1;
  char *local_38;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t codepoint;
  uint32_t state;
  char c;
  char *ptr;
  char *name_local;
  
  _state = (uint8_t *)name;
  ptr = name;
  do {
    while( true ) {
      if (*_state == '\0') {
        return;
      }
      codepoint._3_1_ = *_state;
      bVar1 = isLegalForSymName(codepoint._3_1_);
      if (!bVar1) break;
      putc((int)(char)codepoint._3_1_,(FILE *)symFile);
      _state = _state + 1;
    }
    local_20 = 0;
    while (decode(&local_20,&local_24,*_state), local_20 != 1) {
      _state = _state + 1;
      if (local_20 == 0) goto LAB_001085ba;
    }
    local_24 = 0xfffd;
    for (; ((int)(char)*_state & 0xc0U) == 0x80; _state = _state + 1) {
    }
LAB_001085ba:
    if (local_24 < 0x10000) {
      local_38 = "\\u%04x";
    }
    else {
      local_38 = "\\U%08x";
    }
    fprintf((FILE *)symFile,local_38,(ulong)local_24);
  } while( true );
}

Assistant:

static void printSymName(char const *name)
{
	for (char const *ptr = name; *ptr != '\0'; ) {
		char c = *ptr;

		if (isLegalForSymName(c)) {
			// Output legal ASCII characters as-is
			putc(c, symFile);
			++ptr;
		} else {
			// Output illegal characters using Unicode escapes
			// Decode the UTF-8 codepoint; or at least attempt to
			uint32_t state = 0, codepoint;

			do {
				decode(&state, &codepoint, *ptr);
				if (state == 1) {
					// This sequence was invalid; emit a U+FFFD, and recover
					codepoint = 0xFFFD;
					// Skip continuation bytes
					// A NUL byte does not qualify, so we're good
					while ((*ptr & 0xC0) == 0x80)
						++ptr;
					break;
				}
				++ptr;
			} while (state != 0);

			fprintf(symFile, codepoint <= 0xFFFF ? "\\u%04" PRIx32 : "\\U%08" PRIx32,
				codepoint);
		}
	}
}